

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void av1_cyclic_refresh_update_segment
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int64_t rate,
               int64_t dist,int skip,RUN_TYPE dry_run)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int map_offset;
  int mi_y;
  int mi_stride;
  char in_stack_00000018;
  uint8_t segment_id;
  int new_map_value;
  int sh;
  int refresh_this_block;
  int noise_level;
  int block_index;
  int ymis;
  int xmis;
  int bh;
  int bw;
  CYCLIC_REFRESH *cr;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  lVar2 = *(long *)(in_RDI + 0x712a8);
  uVar4 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B]
  ;
  uVar5 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B]
  ;
  if (*(int *)(in_RDI + 0x3c198) - in_ECX < (int)uVar4) {
    uVar4 = *(int *)(in_RDI + 0x3c198) - in_ECX;
  }
  if (*(int *)(in_RDI + 0x3c194) - in_EDX < (int)uVar5) {
    uVar5 = *(int *)(in_RDI + 0x3c194) - in_EDX;
  }
  iVar6 = in_EDX * *(int *)(in_RDI + 0x3c198) + in_ECX;
  iVar7 = candidate_refresh_aq
                    ((CYCLIC_REFRESH *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                     ,(MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     CONCAT44(in_stack_ffffffffffffff84,uVar4),(BLOCK_SIZE)(uVar5 >> 0x18),
                     in_stack_ffffffffffffff78);
  iVar8 = 1;
  if (*(int *)(*(long *)(in_RDI + 0x712a8) + 0x6c) != 0) {
    iVar8 = 2;
  }
  uVar9 = (uint)*(char *)(*(long *)(lVar2 + 0x28) + (long)iVar6);
  iVar10 = cyclic_refresh_segment_id_boosted((uint)((byte)*(undefined2 *)(lVar1 + 0xa7) & 7));
  if ((iVar10 != 0) &&
     (*(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xfff8 | (byte)iVar7 & 7, mi_y != 0))
  {
    *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xfff8;
  }
  uVar3 = (uint)(byte)*(undefined2 *)(lVar1 + 0xa7);
  uVar12 = (uVar3 & 7) << 0x18;
  iVar10 = cyclic_refresh_segment_id_boosted(uVar3 & 7);
  if (iVar10 == 0) {
    if (iVar7 == 0) {
      uVar9 = 1;
    }
    else if (*(char *)(*(long *)(lVar2 + 0x28) + (long)iVar6) == '\x01') {
      uVar9 = 0;
    }
  }
  else {
    uVar9 = -*(int *)(lVar2 + 0x14);
  }
  iVar7 = *(int *)(in_RDI + 0x3c198);
  for (iVar10 = 0; iVar10 < (int)uVar5; iVar10 = iVar8 + iVar10) {
    iVar11 = iVar6 + iVar10 * iVar7;
    memset((void *)(*(long *)(lVar2 + 0x28) + (long)iVar11),uVar9 & 0xff,(long)(int)uVar4);
    memset((void *)(*(long *)(in_RDI + 0x71298) + (long)iVar11),uVar12 >> 0x18,(long)(int)uVar4);
    memset((void *)(*(long *)(*(long *)(in_RDI + 0x3c068) + 0x50) + (long)iVar11),uVar12 >> 0x18,
           (long)(int)uVar4);
  }
  if (in_stack_00000018 == '\0') {
    iVar6 = cyclic_refresh_segment_id(uVar12 >> 0x18);
    if (iVar6 == 1) {
      *(uint *)(in_RSI + 0x15234) = uVar4 * uVar5 + *(int *)(in_RSI + 0x15234);
    }
    else {
      iVar6 = cyclic_refresh_segment_id(uVar12 >> 0x18);
      if (iVar6 == 2) {
        *(uint *)(in_RSI + 0x15238) = uVar4 * uVar5 + *(int *)(in_RSI + 0x15238);
      }
    }
  }
  return;
}

Assistant:

void av1_cyclic_refresh_update_segment(const AV1_COMP *cpi, MACROBLOCK *const x,
                                       int mi_row, int mi_col, BLOCK_SIZE bsize,
                                       int64_t rate, int64_t dist, int skip,
                                       RUN_TYPE dry_run) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
  const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
  int noise_level = 0;
  if (cpi->noise_estimate.enabled) noise_level = cpi->noise_estimate.level;
  const int refresh_this_block =
      candidate_refresh_aq(cr, mbmi, rate, dist, bsize, noise_level);
  int sh = cpi->cyclic_refresh->skip_over4x4 ? 2 : 1;
  // Default is to not update the refresh map.
  int new_map_value = cr->map[block_index];

  // If this block is labeled for refresh, check if we should reset the
  // segment_id.
  if (cyclic_refresh_segment_id_boosted(mbmi->segment_id)) {
    mbmi->segment_id = refresh_this_block;
    // Reset segment_id if will be skipped.
    if (skip) mbmi->segment_id = CR_SEGMENT_ID_BASE;
  }
  const uint8_t segment_id = mbmi->segment_id;

  // Update the cyclic refresh map, to be used for setting segmentation map
  // for the next frame. If the block  will be refreshed this frame, mark it
  // as clean. The magnitude of the -ve influences how long before we consider
  // it for refresh again.
  if (cyclic_refresh_segment_id_boosted(segment_id)) {
    new_map_value = -cr->time_for_refresh;
  } else if (refresh_this_block) {
    // Else if it is accepted as candidate for refresh, and has not already
    // been refreshed (marked as 1) then mark it as a candidate for cleanup
    // for future time (marked as 0), otherwise don't update it.
    if (cr->map[block_index] == 1) new_map_value = 0;
  } else {
    // Leave it marked as block that is not candidate for refresh.
    new_map_value = 1;
  }

  // Update entries in the cyclic refresh map with new_map_value, and
  // copy mbmi->segment_id into global segmentation map.
  const int mi_stride = cm->mi_params.mi_cols;
  for (int mi_y = 0; mi_y < ymis; mi_y += sh) {
    const int map_offset = block_index + mi_y * mi_stride;
    memset(&cr->map[map_offset], new_map_value, xmis);
    memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
    memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
  }

  // Accumulate cyclic refresh update counters.
  if (!dry_run) {
    if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks += xmis * ymis;
    else if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks += xmis * ymis;
  }
}